

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O2

void place_branch(level *lev,branch *br,xchar x,xchar y)

{
  d_level *lev1;
  boolean bVar1;
  uint uVar2;
  mkroom *croom;
  char cVar3;
  char cVar4;
  uint uVar5;
  int x_00;
  d_level *src;
  coord m;
  coord local_42;
  branch *local_40;
  d_level *local_38;
  
  if ((br != (branch *)0x0) && ((made_branch & 1) == 0)) {
    local_40 = br;
    if (x == '\0') {
      x_00 = lev->nroom;
      if (x_00 == 0) {
        mazexy(lev,&local_42);
        croom = (mkroom *)0x0;
        x = local_42.x;
        y = local_42.y;
      }
      else {
        if (x_00 < 3) {
          uVar5 = rn2(x_00);
          croom = lev->rooms + uVar5;
        }
        else {
          uVar5 = 0;
          while( true ) {
            uVar2 = rn2(x_00);
            croom = lev->rooms + uVar2;
            if ((((croom != lev->dnstairs_room) && (croom != lev->upstairs_room)) &&
                (croom->rtype == '\0')) || (0x62 < uVar5)) break;
            uVar5 = uVar5 + 1;
            x_00 = lev->nroom;
          }
        }
        do {
          bVar1 = somexy(lev,croom,&local_42);
          if (bVar1 == '\0') {
            impossible("Can\'t place branch!");
          }
          bVar1 = occupied(lev,local_42.x,local_42.y);
        } while ((bVar1 != '\0') ||
                (br = local_40, x = local_42.x, y = local_42.y,
                (lev->locations[local_42.x][local_42.y].typ & 0xfeU) != 0x18));
      }
    }
    else {
      croom = pos_to_room(lev,x,y);
    }
    lev1 = &br->end1;
    local_38 = &lev->z;
    bVar1 = on_level(lev1,local_38);
    src = &br->end2;
    if (bVar1 == '\0') {
      src = lev1;
    }
    if (br->type == 3) {
      mkportal(lev,x,y,src->dnum,src->dlevel);
    }
    else if (br->type != (bVar1 == '\0') + 1) {
      (lev->sstairs).sx = x;
      (lev->sstairs).sy = y;
      bVar1 = on_level(lev1,local_38);
      cVar3 = (char)*(undefined4 *)&local_40->end1_up;
      cVar4 = cVar3 == '\0';
      if (bVar1 != '\0') {
        cVar4 = cVar3;
      }
      (lev->sstairs).up = cVar4;
      assign_level(&(lev->sstairs).tolev,src);
      lev->sstairs_room = croom;
      *(uint *)&lev->locations[x][y].field_0x6 =
           (uint)((lev->sstairs).up == '\0') * 0x10 +
           (*(uint *)&lev->locations[x][y].field_0x6 & 0xfffffe0f) + 0x10;
      lev->locations[x][y].typ = '\x1a';
    }
    made_branch = 1;
  }
  return;
}

Assistant:

void place_branch(struct level *lev,
		  branch *br,		/* branch to place */
		  xchar x,  xchar y)	/* location */
{
	coord	      m;
	d_level	      *dest;
	boolean	      make_stairs;
	struct mkroom *br_room;

	/*
	 * Return immediately if there is no branch to make or we have
	 * already made one.  This routine can be called twice when
	 * a special level is loaded that specifies an SSTAIR location
	 * as a favored spot for a branch.
	 */
	if (!br || made_branch) return;

	if (!x) {	/* find random coordinates for branch */
	    br_room = find_branch_room(lev, &m);
	    x = m.x;
	    y = m.y;
	} else {
	    br_room = pos_to_room(lev, x, y);
	}

	if (on_level(&br->end1, &lev->z)) {
	    /* we're on end1 */
	    make_stairs = br->type != BR_NO_END1;
	    dest = &br->end2;
	} else {
	    /* we're on end2 */
	    make_stairs = br->type != BR_NO_END2;
	    dest = &br->end1;
	}

	if (br->type == BR_PORTAL) {
	    mkportal(lev, x, y, dest->dnum, dest->dlevel);
	} else if (make_stairs) {
	    lev->sstairs.sx = x;
	    lev->sstairs.sy = y;
	    lev->sstairs.up = (char) on_level(&br->end1, &lev->z) ?
					    br->end1_up : !br->end1_up;
	    assign_level(&lev->sstairs.tolev, dest);
	    lev->sstairs_room = br_room;

	    lev->locations[x][y].ladder = lev->sstairs.up ? LA_UP : LA_DOWN;
	    lev->locations[x][y].typ = STAIRS;
	}
	/*
	 * Set made_branch to TRUE even if we didn't make a stairwell (i.e.
	 * make_stairs is false) since there is currently only one branch
	 * per level, if we failed once, we're going to fail again on the
	 * next call.
	 */
	made_branch = TRUE;
}